

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_ge_table_set_globalz(size_t len,secp256k1_ge *a,secp256k1_fe *zr)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  secp256k1_scalar *r;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  secp256k1_fe *psVar8;
  ulong uVar9;
  secp256k1_fe *r_00;
  secp256k1_ge *psVar10;
  secp256k1_fe *psVar11;
  secp256k1_fe zs;
  secp256k1_fe zi2;
  secp256k1_fe local_c8;
  secp256k1_fe local_90;
  secp256k1_fe local_60;
  
  sVar5 = len;
  psVar10 = a;
  psVar8 = zr;
  if (len != 0) {
    do {
      secp256k1_ge_verify(psVar10);
      secp256k1_fe_verify(psVar8);
      sVar5 = sVar5 - 1;
      psVar10 = psVar10 + 1;
      psVar8 = psVar8 + 1;
    } while (sVar5 != 0);
    lVar1 = len - 1;
    psVar11 = &a[lVar1].y;
    secp256k1_fe_verify(psVar11);
    uVar2 = a[lVar1].y.n[4];
    uVar4 = (uVar2 >> 0x30) * 0x1000003d1 + psVar11->n[0];
    uVar3 = (uVar4 >> 0x34) + a[lVar1].y.n[1];
    uVar7 = (uVar3 >> 0x34) + a[lVar1].y.n[2];
    uVar9 = (uVar7 >> 0x34) + a[lVar1].y.n[3];
    psVar8 = (secp256k1_fe *)(uVar7 & 0xfffffffffffff);
    psVar11->n[0] = uVar4 & 0xfffffffffffff;
    a[lVar1].y.n[1] = uVar3 & 0xfffffffffffff;
    a[lVar1].y.n[2] = (uint64_t)psVar8;
    a[lVar1].y.n[3] = uVar9 & 0xfffffffffffff;
    a[lVar1].y.n[4] = (uVar9 >> 0x34) + (uVar2 & 0xffffffffffff);
    a[lVar1].y.magnitude = 1;
    secp256k1_fe_verify(psVar11);
    local_c8.n[0] = zr[lVar1].n[0];
    local_c8.n[1] = zr[lVar1].n[1];
    local_c8.n[2] = zr[lVar1].n[2];
    local_c8.n[3] = (zr[lVar1].n + 2)[1];
    local_c8.n[4] = zr[lVar1].n[4];
    local_c8._40_8_ = (zr[lVar1].n + 4)[1];
    if (lVar1 != 0) {
      psVar10 = a + (len - 2);
      psVar11 = zr + len;
      lVar6 = 0;
      do {
        psVar11 = psVar11 + -1;
        if (lVar6 != 0) {
          psVar8 = &local_c8;
          secp256k1_fe_mul(&local_c8,&local_c8,psVar11);
        }
        secp256k1_ge_verify(psVar10);
        r_00 = &local_c8;
        secp256k1_fe_verify(&local_c8);
        if (psVar10->infinity != 0) {
          secp256k1_ge_table_set_globalz_cold_1();
          secp256k1_scalar_verify(r);
          r_00->n[0] = r->d[0];
          r_00->n[1] = r->d[1];
          r_00->n[2] = 0;
          r_00->n[3] = 0;
          psVar8->n[0] = r->d[2];
          psVar8->n[1] = r->d[3];
          psVar8->n[2] = 0;
          psVar8->n[3] = 0;
          secp256k1_scalar_verify((secp256k1_scalar *)r_00);
          secp256k1_scalar_verify((secp256k1_scalar *)psVar8);
          return;
        }
        secp256k1_fe_sqr(&local_60,&local_c8);
        secp256k1_fe_mul(&local_90,&local_60,&local_c8);
        secp256k1_fe_mul(&psVar10->x,&psVar10->x,&local_60);
        psVar8 = &psVar10->y;
        secp256k1_fe_mul(psVar8,psVar8,&local_90);
        secp256k1_ge_verify(psVar10);
        lVar6 = lVar6 + 1;
        psVar10 = psVar10 + -1;
      } while (lVar1 != lVar6);
      if (len == 0) {
        return;
      }
    }
    do {
      secp256k1_ge_verify(a);
      a = a + 1;
      len = len - 1;
    } while (len != 0);
  }
  return;
}

Assistant:

static void secp256k1_ge_table_set_globalz(size_t len, secp256k1_ge *a, const secp256k1_fe *zr) {
    size_t i;
    secp256k1_fe zs;
#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GE_VERIFY(&a[i]);
        SECP256K1_FE_VERIFY(&zr[i]);
    }
#endif

    if (len > 0) {
        i = len - 1;
        /* Ensure all y values are in weak normal form for fast negation of points */
        secp256k1_fe_normalize_weak(&a[i].y);
        zs = zr[i];

        /* Work our way backwards, using the z-ratios to scale the x/y values. */
        while (i > 0) {
            if (i != len - 1) {
                secp256k1_fe_mul(&zs, &zs, &zr[i]);
            }
            i--;
            secp256k1_ge_set_ge_zinv(&a[i], &a[i], &zs);
        }
    }

#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GE_VERIFY(&a[i]);
    }
#endif
}